

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

int Ivy_ManSeqFindCut_int(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSizeLimit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ivy_Obj_t *pObj;
  uint local_8c;
  int local_88;
  int Counter;
  int LeavesBest [10];
  int local_54;
  int i;
  int nLatches;
  int Next;
  int LeafBest;
  int Leaf;
  int CostCur;
  int CostBest;
  Ivy_Obj_t *pNode;
  int nSizeLimit_local;
  Vec_Int_t *vInside_local;
  Vec_Int_t *vFront_local;
  Ivy_Man_t *p_local;
  
  Leaf = 99;
  local_8c = 0xffffffff;
  for (local_54 = 0; iVar1 = Vec_IntSize(vFront), local_54 < iVar1; local_54 = local_54 + 1) {
    iVar1 = Vec_IntEntry(vFront,local_54);
    iVar2 = Ivy_NodeGetLeafCostOne(p,iVar1,vInside);
    if (iVar2 < Leaf) {
      local_8c = 1;
      local_88 = iVar1;
      Leaf = iVar2;
    }
    else if (Leaf == iVar2) {
      (&local_88)[(int)local_8c] = iVar1;
      local_8c = local_8c + 1;
    }
    if (Leaf < 2) break;
  }
  if (Leaf == 99) {
    p_local._4_4_ = 0;
  }
  else {
    if (2 < Leaf) {
      __assert_fail("CostBest < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                    ,0x7d,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
    }
    iVar1 = Vec_IntSize(vFront);
    if (nSizeLimit < iVar1 + -1 + Leaf) {
      p_local._4_4_ = 0;
    }
    else {
      if ((int)local_8c < 1) {
        __assert_fail("Counter > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                      ,0x82,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      printf("%d",(ulong)local_8c);
      iVar1 = rand();
      iVar1 = (&local_88)[iVar1 % (int)local_8c];
      if (iVar1 < 0) {
        __assert_fail("LeafBest >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                      ,0x88,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      Vec_IntRemove(vFront,iVar1);
      iVar2 = Ivy_LeafId(iVar1);
      pObj = Ivy_ManObj(p,iVar2);
      iVar1 = Ivy_LeafLat(iVar1);
      iVar2 = Ivy_ObjIsLatch(pObj);
      iVar3 = Ivy_ObjIsNode(pObj);
      if (((iVar3 == 0) && (iVar3 = Ivy_ObjIsLatch(pObj), iVar3 == 0)) &&
         (iVar3 = Ivy_ObjIsBuf(pObj), iVar3 == 0)) {
        __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                      ,0x8f,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
        ;
      }
      iVar3 = Ivy_ObjFaninId0(pObj);
      iVar3 = Ivy_LeafCreate(iVar3,iVar1 + iVar2);
      if ((iVar3 != 0) && (iVar4 = Vec_IntFind(vInside,iVar3), iVar4 == -1)) {
        Vec_IntPush(vFront,iVar3);
        Vec_IntPush(vInside,iVar3);
      }
      iVar3 = Ivy_ObjIsLatch(pObj);
      if ((iVar3 == 0) && (iVar3 = Ivy_ObjIsBuf(pObj), iVar3 == 0)) {
        iVar3 = Ivy_ObjIsNode(pObj);
        if (iVar3 == 0) {
          __assert_fail("Ivy_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                        ,0x9d,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        iVar3 = Ivy_ObjFaninId1(pObj);
        iVar1 = Ivy_LeafCreate(iVar3,iVar1 + iVar2);
        if ((iVar1 != 0) && (iVar2 = Vec_IntFind(vInside,iVar1), iVar2 == -1)) {
          Vec_IntPush(vFront,iVar1);
          Vec_IntPush(vInside,iVar1);
        }
        iVar1 = Vec_IntSize(vFront);
        if (nSizeLimit < iVar1) {
          __assert_fail("Vec_IntSize(vFront) <= nSizeLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                        ,0xa7,
                        "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
        }
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManSeqFindCut_int( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSizeLimit )
{
    Ivy_Obj_t * pNode;
    int CostBest, CostCur, Leaf, LeafBest, Next, nLatches, i;
    int LeavesBest[10];
    int Counter;

    // add random selection of the best fanin!!!

    // find the best fanin
    CostBest = 99;
    LeafBest = -1;
    Counter = -1;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_IntForEachEntry( vFront, Leaf, i )
    {
        CostCur = Ivy_NodeGetLeafCostOne( p, Leaf, vInside );
//printf( "    Fanin %s has cost %d.\n", Ivy_ObjName(pNode), CostCur );
        if ( CostBest > CostCur )
        {
            CostBest = CostCur;
            LeafBest = Leaf;
            LeavesBest[0] = Leaf;
            Counter = 1;
        }
        else if ( CostBest == CostCur )
            LeavesBest[Counter++] = Leaf;

        if ( CostBest <= 1 ) // can be if ( CostBest <= 1 )
            break;
    }
    if ( CostBest == 99 )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( CostBest < 3 );
    if ( Vec_IntSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( Counter > 0 );
printf( "%d", Counter );

    LeafBest = LeavesBest[rand() % Counter];

    // remove the node from the array
    assert( LeafBest >= 0 );
    Vec_IntRemove( vFront, LeafBest );
//printf( "Removing fanin %s.\n", Ivy_ObjName(pNode) );

    // get the node and its latches
    pNode = Ivy_ManObj( p, Ivy_LeafId(LeafBest) );
    nLatches = Ivy_LeafLat(LeafBest) + Ivy_ObjIsLatch(pNode);
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) );

    // add the left child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId0(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }

    // quit if this is the one fanin node
    if ( Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
        return 1;
    assert( Ivy_ObjIsNode(pNode) );

    // add the right child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId1(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }
    assert( Vec_IntSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}